

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void printfFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  u32 n;
  uchar *zFormat;
  char *z;
  PrintfArguments x;
  StrAccum str;
  StrAccum local_40;
  
  if (0 < argc) {
    psVar1 = context->pOut->db;
    zFormat = sqlite3_value_text(*argv);
    if (zFormat != (uchar *)0x0) {
      local_40.mxAlloc = psVar1->aLimit[0];
      local_40.zText = (char *)0x0;
      local_40.nAlloc = 0;
      local_40.nChar = 0;
      local_40.accError = '\0';
      local_40.printfFlags = '\x02';
      local_40.db = psVar1;
      sqlite3_str_appendf(&local_40,(char *)zFormat);
      n = local_40.nChar;
      z = sqlite3StrAccumFinish(&local_40);
      sqlite3_result_text(context,z,n,sqlite3MallocSize);
    }
  }
  return;
}

Assistant:

static void printfFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  PrintfArguments x;
  StrAccum str;
  const char *zFormat;
  int n;
  sqlite3 *db = sqlite3_context_db_handle(context);

  if( argc>=1 && (zFormat = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    x.nArg = argc-1;
    x.nUsed = 0;
    x.apArg = argv+1;
    sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
    str.printfFlags = SQLITE_PRINTF_SQLFUNC;
    sqlite3_str_appendf(&str, zFormat, &x);
    n = str.nChar;
    sqlite3_result_text(context, sqlite3StrAccumFinish(&str), n,
                        SQLITE_DYNAMIC);
  }
}